

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall slang::parsing::Parser::isPlainPortName(Parser *this)

{
  bool bVar1;
  byte bVar2;
  Token TVar3;
  uint32_t index;
  uint32_t local_14;
  
  local_14 = 1;
  do {
    TVar3 = ParserBase::peek(&this->super_ParserBase,local_14);
    if (TVar3.kind != OpenBracket) {
      TVar3 = ParserBase::peek(&this->super_ParserBase,local_14);
      if (TVar3.kind < DoubleEquals) {
        bVar2 = (byte)(0x100000010c0000 >> ((byte)TVar3.kind & 0x3f));
      }
      else {
        bVar2 = 0;
      }
      goto LAB_0065b3fe;
    }
    local_14 = local_14 + 1;
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInPortReference>
                      (this,&local_14,OpenBracket,CloseBracket);
  } while (bVar1);
  bVar2 = 1;
LAB_0065b3fe:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Parser::isPlainPortName() {
    uint32_t index = 1;
    while (peek(index).kind == TokenKind::OpenBracket) {
        index++;
        if (!scanTypePart<isNotInPortReference>(index, TokenKind::OpenBracket,
                                                TokenKind::CloseBracket)) {
            return true; // if we see nonsense, we'll recover by pretending this is a plain port
        }
    }

    auto kind = peek(index).kind;
    switch (kind) {
        case TokenKind::Equals:
        case TokenKind::Comma:
        case TokenKind::CloseParenthesis:
        case TokenKind::Semicolon:
            return true;
        default:
            return false;
    }
}